

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::copyAppend
          (QGenericArrayOps<QList<QGraphicsItem_*>_> *this,qsizetype n,parameter_type t)

{
  QList<QGraphicsItem_*> *this_00;
  long in_RSI;
  QList<QGraphicsItem_*> *in_RDI;
  QList<QGraphicsItem_*> *data;
  long local_10;
  
  if (in_RSI != 0) {
    this_00 = QArrayDataPointer<QList<QGraphicsItem_*>_>::begin
                        ((QArrayDataPointer<QList<QGraphicsItem_*>_> *)0xa1d783);
    local_10 = in_RSI;
    while (local_10 != 0) {
      QList<QGraphicsItem_*>::QList(this_00,in_RDI);
      (in_RDI->d).size = (in_RDI->d).size + 1;
      local_10 = local_10 + -1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t)
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *data = this->begin();
        while (n--) {
            new (data + this->size) T(t);
            ++this->size;
        }
    }